

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_RunLengthDecode.hh
# Opt level: O1

Pipeline * __thiscall SF_RunLengthDecode::getDecodePipeline(SF_RunLengthDecode *this,Pipeline *next)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Pl_RunLength *pPVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_2d;
  action_e local_2c;
  Pl_RunLength *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  Pipeline *local_18;
  
  local_2c = a_decode;
  local_28 = (Pl_RunLength *)0x0;
  local_18 = next;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Pl_RunLength,std::allocator<Pl_RunLength>,char_const(&)[17],Pipeline*&,Pl_RunLength::action_e>
            (&_Stack_20,&local_28,(allocator<Pl_RunLength> *)&local_2d,
             (char (*) [17])"runlength decode",&local_18,&local_2c);
  _Var2._M_pi = _Stack_20._M_pi;
  pPVar1 = local_28;
  local_28 = (Pl_RunLength *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &pPVar1->super_Pipeline;
  (this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  return (this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

Pipeline*
    getDecodePipeline(Pipeline* next) override
    {
        this->pipeline =
            std::make_shared<Pl_RunLength>("runlength decode", next, Pl_RunLength::a_decode);
        return this->pipeline.get();
    }